

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::XFBStrideOfEmptyListAndAPITest::getBufferDescriptors
          (XFBStrideOfEmptyListAndAPITest *this,GLuint test_case_index,Vector *out_descriptors)

{
  pointer pbVar1;
  GLuint i;
  int iVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  if (test_case_index == 2) {
    std::
    vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
    ::resize(out_descriptors,2);
    pbVar1 = (out_descriptors->
             super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1->m_index = 0;
    pbVar1->m_target = Uniform;
    pbVar1[1].m_index = 0;
    pbVar1[1].m_target = Transform_feedback;
    Utils::Type::GenerateDataPacked
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
               (Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pbVar1->m_initial_data,&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pbVar1[1].m_initial_data,0x40);
  }
  else if (test_case_index == 1) {
    std::
    vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
    ::resize(out_descriptors,2);
    pbVar1 = (out_descriptors->
             super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1->m_index = 0;
    pbVar1->m_target = Uniform;
    pbVar1[1].m_index = 1;
    pbVar1[1].m_target = Transform_feedback;
    Utils::Type::GenerateDataPacked
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
               (Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pbVar1->m_initial_data,&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    Utils::Type::GenerateDataPacked
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
               (Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pbVar1[1].m_initial_data,&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  }
  else if (test_case_index == 0) {
    std::
    vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
    ::resize(out_descriptors,3);
    pbVar1 = (out_descriptors->
             super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1->m_index = 0;
    pbVar1->m_target = Uniform;
    pbVar1[1].m_index = 0;
    pbVar1[1].m_target = Transform_feedback;
    pbVar1[2].m_index = 1;
    pbVar1[2].m_target = Transform_feedback;
    Utils::Type::GenerateDataPacked
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
               (Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pbVar1->m_initial_data,&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pbVar1[1].m_initial_data,0x40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pbVar1[1].m_expected_data,0x40);
    for (iVar2 = 0; iVar2 != 0x40; iVar2 = iVar2 + 1) {
      *pbVar1[1].m_initial_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start = (uchar)iVar2;
      *pbVar1[1].m_expected_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start = (uchar)iVar2;
    }
    Utils::Type::GenerateDataPacked
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
               (Type *)&Utils::Type::vec4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pbVar1[2].m_initial_data,&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pbVar1[2].m_expected_data,&pbVar1->m_initial_data);
  }
  return;
}

Assistant:

void XFBStrideOfEmptyListAndAPITest::getBufferDescriptors(glw::GLuint				test_case_index,
														  bufferDescriptor::Vector& out_descriptors)
{
	switch (test_case_index)
	{
	case VALID:
	{
		/* Test needs single uniform and two xfbs */
		out_descriptors.resize(3);

		/* Get references */
		bufferDescriptor& uniform = out_descriptors[0];
		bufferDescriptor& xfb_0   = out_descriptors[1];
		bufferDescriptor& xfb_1   = out_descriptors[2];

		/* Index */
		uniform.m_index = 0;
		xfb_0.m_index   = 0;
		xfb_1.m_index   = 1;

		/* Target */
		uniform.m_target = Utils::Buffer::Uniform;
		xfb_0.m_target   = Utils::Buffer::Transform_feedback;
		xfb_1.m_target   = Utils::Buffer::Transform_feedback;

		/* Data */
		uniform.m_initial_data = Utils::Type::vec4.GenerateDataPacked();

		/* Data, contents are the same as no modification is expected */
		xfb_0.m_initial_data.resize(m_stride);
		xfb_0.m_expected_data.resize(m_stride);

		for (GLuint i = 0; i < m_stride; ++i)
		{
			xfb_0.m_initial_data[0]  = (glw::GLubyte)i;
			xfb_0.m_expected_data[0] = (glw::GLubyte)i;
		}

		xfb_1.m_initial_data  = Utils::Type::vec4.GenerateDataPacked();
		xfb_1.m_expected_data = uniform.m_initial_data;
	}

	break;

	case FIRST_MISSING:
	{
		/* Test needs single uniform and two xfbs */
		out_descriptors.resize(2);

		/* Get references */
		bufferDescriptor& uniform = out_descriptors[0];
		bufferDescriptor& xfb_1   = out_descriptors[1];

		/* Index */
		uniform.m_index = 0;
		xfb_1.m_index   = 1;

		/* Target */
		uniform.m_target = Utils::Buffer::Uniform;
		xfb_1.m_target   = Utils::Buffer::Transform_feedback;

		/* Data */
		uniform.m_initial_data = Utils::Type::vec4.GenerateDataPacked();

		/* Draw call will not be executed, contents does not matter */
		xfb_1.m_initial_data = Utils::Type::vec4.GenerateDataPacked();
	}

	break;

	case SECOND_MISSING:
	{
		/* Test needs single uniform and two xfbs */
		out_descriptors.resize(2);

		/* Get references */
		bufferDescriptor& uniform = out_descriptors[0];
		bufferDescriptor& xfb_0   = out_descriptors[1];

		/* Index */
		uniform.m_index = 0;
		xfb_0.m_index   = 0;

		/* Target */
		uniform.m_target = Utils::Buffer::Uniform;
		xfb_0.m_target   = Utils::Buffer::Transform_feedback;

		/* Data */
		uniform.m_initial_data = Utils::Type::vec4.GenerateDataPacked();

		/* Draw call will not be executed, contents does not matter */
		xfb_0.m_initial_data.resize(m_stride);
	}

	break;
	}
}